

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::initialize(WindowImplX11 *this)

{
  XIM p_Var1;
  long lVar2;
  ostream *poVar3;
  WindowImplX11 *this_00;
  value_type this_01;
  long *in_RDI;
  Lock lock;
  Atom wmWindowTypeNormal;
  Atom wmWindowType;
  WindowImplX11 *in_stack_000000e0;
  value_type *in_stack_ffffffffffffff38;
  vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>
  *in_stack_ffffffffffffff40;
  Mutex *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff78;
  allocator local_71;
  string local_70 [32];
  value_type local_50 [3];
  allocator local_31;
  string local_30 [32];
  WindowImplX11 *local_10;
  
  p_Var1 = OpenXIM();
  in_RDI[0x7c] = (long)p_Var1;
  if (in_RDI[0x7c] == 0) {
    in_RDI[0x7d] = 0;
  }
  else {
    in_stack_ffffffffffffff38 = (value_type *)0x408;
    in_stack_ffffffffffffff40 =
         (vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_> *)0x0;
    lVar2 = XCreateIC(in_RDI[0x7c],"clientWindow",in_RDI[0x79],"focusWindow",in_RDI[0x79],
                      "inputStyle");
    in_RDI[0x7d] = lVar2;
  }
  if (in_RDI[0x7d] == 0) {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,
                             "Failed to create input context for window -- TextEntered event won\'t be able to return unicode"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"_NET_WM_WINDOW_TYPE",&local_31);
  this_00 = (WindowImplX11 *)getAtom(in_stack_ffffffffffffff78,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"_NET_WM_WINDOW_TYPE_NORMAL",&local_71);
  this_01 = (value_type)getAtom(in_stack_ffffffffffffff78,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_50[0] = this_01;
  if ((local_10 != (WindowImplX11 *)0x0) && (this_01 != (value_type)0x0)) {
    in_stack_ffffffffffffff38 = local_50;
    in_stack_ffffffffffffff40 =
         (vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_> *)
         CONCAT44((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),1);
    XChangeProperty(in_RDI[0x7a],in_RDI[0x79],local_10,4,0x20,0);
  }
  (**(code **)(*in_RDI + 0x48))(in_RDI,1);
  grabFocus(in_stack_000000e0);
  createHiddenCursor(this_00);
  XFlush(in_RDI[0x7a]);
  Lock::Lock((Lock *)this_01,in_stack_ffffffffffffff48);
  std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::push_back
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  Lock::~Lock((Lock *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void WindowImplX11::initialize()
{
    using namespace WindowsImplX11Impl;

    // Create the input context
    m_inputMethod = OpenXIM();

    if (m_inputMethod)
    {
        m_inputContext = XCreateIC(m_inputMethod,
                                   XNClientWindow,
                                   m_window,
                                   XNFocusWindow,
                                   m_window,
                                   XNInputStyle,
                                   XIMPreeditNothing | XIMStatusNothing,
                                   NULL);
    }
    else
    {
        m_inputContext = NULL;
    }

    if (!m_inputContext)
        err() << "Failed to create input context for window -- TextEntered event won't be able to return unicode" << std::endl;

    Atom wmWindowType = getAtom("_NET_WM_WINDOW_TYPE", false);
    Atom wmWindowTypeNormal = getAtom("_NET_WM_WINDOW_TYPE_NORMAL", false);

    if (wmWindowType && wmWindowTypeNormal)
    {
        XChangeProperty(m_display,
                        m_window,
                        wmWindowType,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        reinterpret_cast<const unsigned char*>(&wmWindowTypeNormal),
                        1);
    }

    // Show the window
    setVisible(true);

    // Raise the window and grab input focus
    grabFocus();

    // Create the hidden cursor
    createHiddenCursor();

    // Flush the commands queue
    XFlush(m_display);

    // Add this window to the global list of windows (required for focus request)
    Lock lock(allWindowsMutex);
    allWindows.push_back(this);
}